

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Expression * andE(void)

{
  TokenList *pTVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  Token h;
  char *local_38;
  Expression **ppEStack_30;
  char *local_28;
  undefined8 uStack_20;
  
  pEVar2 = equality();
  pTVar1 = head;
  while ((pTVar1 != (TokenList *)0x0 && ((pTVar1->value).type == TOKEN_AND))) {
    head = pTVar1;
    pEVar3 = (Expression *)malloc(0x40);
    pEVar3->type = EXPR_LOGICAL;
    (pEVar3->field_1).binary.line = (pTVar1->value).line;
    if (pTVar1->next == (TokenList *)0x0) {
      local_28 = (char *)0x0;
      uStack_20._0_4_ = -1;
      uStack_20._4_4_ = 0;
      local_38 = (char *)0x3c;
      ppEStack_30 = (Expression **)0x108404;
    }
    else {
      local_38 = *(char **)&pTVar1->value;
      ppEStack_30 = (Expression **)(pTVar1->value).start;
      local_28 = (pTVar1->value).file;
      uStack_20._0_4_ = (pTVar1->value).length;
      uStack_20._4_4_ = (pTVar1->value).line;
      head = pTVar1->next;
    }
    *(char **)((long)&pEVar3->field_1 + 0x20) = local_28;
    *(undefined8 *)((long)&pEVar3->field_1 + 0x28) = uStack_20;
    (pEVar3->field_1).arrayExpression.identifier = local_38;
    (pEVar3->field_1).callExpression.arguments = ppEStack_30;
    (pEVar3->field_1).binary.left = pEVar2;
    pEVar2 = equality();
    (pEVar3->field_1).binary.right = pEVar2;
    pEVar2 = pEVar3;
    pTVar1 = head;
  }
  head = pTVar1;
  return pEVar2;
}

Assistant:

static Expression* andE(){
    Expression* expr = equality();
    while(peek() == TOKEN_AND){
        Expression* logic = newExpression();
        logic->type = EXPR_LOGICAL;
        logic->logical.line = presentLine();
        logic->logical.op = advance();
        logic->logical.left = expr;
        logic->logical.right = equality();
        expr = logic;
    }
    return expr;
}